

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rngFORTRAN_wrap.cxx
# Opt level: O3

void init_rng(int seed)

{
  ulong uVar1;
  size_t __i;
  long lVar2;
  
  uVar1 = (ulong)(uint)seed;
  operator_delete(g_generator,5000);
  g_generator = (mt19937 *)operator_new(5000);
  g_generator->_M_x[0] = uVar1;
  lVar2 = 1;
  do {
    uVar1 = (ulong)(((uint)(uVar1 >> 0x1e) ^ (uint)uVar1) * 0x6c078965 + (int)lVar2);
    g_generator->_M_x[lVar2] = uVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  g_generator->_M_p = 0x270;
  return;
}

Assistant:

void init_rng(int seed) {
    delete g_generator;
    g_generator = new std::mt19937(seed);
}